

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_args_TEXLD(Context_conflict *ctx)

{
  int iVar1;
  Context_conflict *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x02','\0');
  if (iVar1 == 0) {
    iVar1 = shader_version_atleast(ctx,'\x01','\x04');
    if (iVar1 == 0) {
      ctx_local._4_4_ = parse_args_D(ctx);
    }
    else {
      ctx_local._4_4_ = parse_args_DS(ctx);
    }
  }
  else {
    ctx_local._4_4_ = parse_args_DSS(ctx);
  }
  return ctx_local._4_4_;
}

Assistant:

static int parse_args_TEXLD(Context *ctx)
{
    // different registers in px_1_3, ps_1_4, and ps_2_0!
    if (shader_version_atleast(ctx, 2, 0))
        return parse_args_DSS(ctx);
    else if (shader_version_atleast(ctx, 1, 4))
        return parse_args_DS(ctx);
    return parse_args_D(ctx);
}